

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall kj::Path::isWin32Special(Path *this,StringPtr part)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  ArrayPtr<const_char> *other;
  StringPtr str;
  undefined2 local_5c;
  undefined1 local_5a;
  undefined1 local_59;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  ArrayPtr<const_char> local_28;
  ArrayPtr<const_char> local_18;
  
  pcVar4 = part.content.ptr + -1;
  if (pcVar4 != (char *)0x3) {
    if (pcVar4 < (char *)0x4) {
      return false;
    }
    cVar1 = *(char *)((long)&(this->parts).ptr + 3);
    if (cVar1 != '.') {
      if (pcVar4 == (char *)0x4) {
        bVar2 = true;
        if (8 < (byte)(cVar1 - 0x31U)) {
          return false;
        }
      }
      else {
        bVar2 = true;
        if (*(char *)((long)&(this->parts).ptr + 4) != '.' || 8 < (byte)(cVar1 - 0x31U)) {
          return false;
        }
      }
      goto LAB_001cf980;
    }
  }
  bVar2 = false;
LAB_001cf980:
  local_5a = *(undefined1 *)((long)&(this->parts).ptr + 2);
  local_5c = *(undefined2 *)&(this->parts).ptr;
  local_59 = 0;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    if ((byte)(*(byte *)((long)&local_5c + lVar3) + 0xbf) < 0x1a) {
      *(byte *)((long)&local_5c + lVar3) = *(byte *)((long)&local_5c + lVar3) | 0x20;
    }
  }
  local_58.ptr = (char *)&local_5c;
  local_58.size_ = 4;
  if (bVar2) {
    local_38.ptr = "com";
    local_38.size_ = 4;
    bVar2 = ArrayPtr<const_char>::operator==(&local_58,&local_38);
    if (bVar2) {
      return true;
    }
    pcVar4 = "lpt";
    other = &local_48;
  }
  else {
    local_38.ptr = "con";
    local_38.size_ = 4;
    bVar2 = ArrayPtr<const_char>::operator==(&local_58,&local_38);
    if (bVar2) {
      return true;
    }
    local_48.ptr = "prn";
    local_48.size_ = 4;
    bVar2 = ArrayPtr<const_char>::operator==(&local_58,&local_48);
    if (bVar2) {
      return true;
    }
    local_18.ptr = "aux";
    local_18.size_ = 4;
    bVar2 = ArrayPtr<const_char>::operator==(&local_58,&local_18);
    if (bVar2) {
      return true;
    }
    pcVar4 = "nul";
    other = &local_28;
  }
  other->ptr = pcVar4;
  other->size_ = 4;
  bVar2 = ArrayPtr<const_char>::operator==(&local_58,other);
  return bVar2;
}

Assistant:

PathPtr PathPtr::parent() const {
  KJ_REQUIRE(parts.size() > 0, "root path has no parent");
  return PathPtr(parts.first(parts.size() - 1));
}